

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

Byte ppmd_read(void *p)

{
  Byte BVar1;
  archive_read *a;
  void *pvVar2;
  Byte *pBVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  ssize_t bytes_avail;
  ssize_t local_20;
  
  a = *p;
  pvVar2 = a->format->data;
  lVar4 = *(long *)((long)pvVar2 + 0x4d88);
  if (lVar4 < 1) {
    local_20 = 0;
    pvVar5 = __archive_read_ahead(a,*(long *)((long)pvVar2 + 0x4d98) + 1,&local_20);
    if ((pvVar5 == (void *)0x0) || (lVar6 = *(long *)((long)pvVar2 + 0x4d98), local_20 <= lVar6)) {
      archive_set_error(&a->archive,0x54,"Truncated 7z file data");
      *(undefined4 *)((long)pvVar2 + 0x4db8) = 1;
      return '\0';
    }
    *(long *)((long)pvVar2 + 0x4d80) = *(long *)((long)pvVar2 + 0x4d80) + 1;
    BVar1 = *(Byte *)((long)pvVar5 + lVar6);
    lVar4 = *(long *)((long)pvVar2 + 0x4d88);
  }
  else {
    pBVar3 = *(Byte **)((long)pvVar2 + 0x4d80);
    lVar6 = *(long *)((long)pvVar2 + 0x4d98);
    *(Byte **)((long)pvVar2 + 0x4d80) = pBVar3 + 1;
    BVar1 = *pBVar3;
  }
  *(long *)((long)pvVar2 + 0x4d88) = lVar4 + -1;
  *(long *)((long)pvVar2 + 0x4d90) = *(long *)((long)pvVar2 + 0x4d90) + 1;
  *(long *)((long)pvVar2 + 0x4d98) = lVar6 + 1;
  return BVar1;
}

Assistant:

static Byte
ppmd_read(void* p) {
	/* Get the handle to current decompression context. */
	struct archive_read *a = ((IByteIn*)p)->a;
	struct zip *zip = (struct zip*) a->format->data;
	ssize_t bytes_avail = 0;

	/* Fetch next byte. */
	const uint8_t* data = __archive_read_ahead(a, 1, &bytes_avail);
	if(bytes_avail < 1) {
		zip->ppmd8_stream_failed = 1;
		return 0;
	}

	__archive_read_consume(a, 1);

	/* Increment the counter. */
	++zip->zipx_ppmd_read_compressed;

	/* Return the next compressed byte. */
	return data[0];
}